

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O3

void __thiscall sjtu::TrainManager::add_train(TrainManager *this,int argc,string *argv)

{
  char *pcVar1;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar2;
  DynamicFileManager<sjtu::trainType> *pDVar3;
  char *pcVar4;
  char *pcVar5;
  TrainManager *pTVar6;
  long *__nptr;
  int iVar7;
  undefined4 uVar8;
  long *plVar9;
  undefined4 extraout_var;
  int *piVar10;
  invalid_command *this_00;
  long lVar11;
  char *pcVar12;
  undefined8 extraout_RDX;
  ulong uVar13;
  string *psVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  pair<long,_bool> pVar18;
  string stopoverTimes;
  string travelTimes;
  string prices;
  string stations;
  string trainID;
  string saleDate;
  string startTime;
  string type;
  string seatNum;
  string stationNum;
  long *local_260 [2];
  long local_250 [2];
  char *local_240;
  long local_238;
  char *local_230;
  long *local_228 [2];
  TrainManager *local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  undefined1 *local_1d0;
  char *local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  char *local_190;
  long local_188;
  char local_180;
  undefined7 uStack_17f;
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  char *local_130;
  undefined8 local_128;
  char local_120;
  undefined7 uStack_11f;
  long *local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  long *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  local_190 = &local_180;
  iVar16 = 0;
  local_188 = 0;
  local_180 = '\0';
  local_f0 = (long *)&local_e0;
  local_e8 = 0;
  local_e0 = 0;
  local_110 = (long *)&local_100;
  local_108 = 0;
  local_100 = 0;
  local_1b0 = &local_1a0;
  local_1a8 = 0;
  local_1a0 = 0;
  local_1d0 = &local_1c0;
  local_1c8 = (char *)0x0;
  local_1c0 = 0;
  local_150 = &local_140;
  local_148 = 0;
  local_140 = 0;
  local_1f0 = &local_1e0;
  local_1e8 = 0;
  local_1e0 = 0;
  local_210 = &local_200;
  local_208 = 0;
  local_200 = 0;
  local_170 = &local_160;
  local_168 = 0;
  local_160 = 0;
  local_130 = &local_120;
  local_128 = 0;
  local_120 = '\0';
  local_218 = this;
  if (0 < argc) {
    do {
      iVar7 = std::__cxx11::string::compare((char *)argv);
      psVar14 = (string *)&local_190;
      if ((iVar7 != 0) &&
         (iVar7 = std::__cxx11::string::compare((char *)argv), psVar14 = (string *)&local_f0,
         iVar7 != 0)) {
        iVar7 = std::__cxx11::string::compare((char *)argv);
        psVar14 = (string *)&local_110;
        if (iVar7 != 0) {
          iVar7 = std::__cxx11::string::compare((char *)argv);
          psVar14 = (string *)&local_1b0;
          if (iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare((char *)argv);
            psVar14 = (string *)&local_1d0;
            if (iVar7 != 0) {
              iVar7 = std::__cxx11::string::compare((char *)argv);
              psVar14 = (string *)&local_150;
              if (iVar7 != 0) {
                iVar7 = std::__cxx11::string::compare((char *)argv);
                psVar14 = (string *)&local_1f0;
                if (iVar7 != 0) {
                  iVar7 = std::__cxx11::string::compare((char *)argv);
                  psVar14 = (string *)&local_210;
                  if (iVar7 != 0) {
                    iVar7 = std::__cxx11::string::compare((char *)argv);
                    psVar14 = (string *)&local_170;
                    if (iVar7 != 0) {
                      iVar7 = std::__cxx11::string::compare((char *)argv);
                      psVar14 = (string *)&local_130;
                      if (iVar7 != 0) goto LAB_001079c0;
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::_M_assign(psVar14);
      argv = argv + 2;
      iVar16 = iVar16 + 2;
    } while (iVar16 < argc);
  }
  pTVar6 = local_218;
  pBVar2 = local_218->TrainBpTree;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_190,local_190 + local_188);
  if (local_c8 == 0) {
    local_260[0] = (long *)0x0;
  }
  else {
    lVar15 = 0;
    lVar11 = 0;
    uVar13 = 0;
    do {
      lVar11 = ((long)*(char *)((long)local_d0 + lVar15) + lVar11 * 0x239 + 0x100) % 0x3b800001;
      uVar13 = (long)((long)*(char *)((long)local_d0 + lVar15) + uVar13 * 0x301 + 0x100) %
               0x3b9aca07;
      lVar15 = lVar15 + 1;
    } while (local_c8 != lVar15);
    local_260[0] = (long *)(lVar11 << 0x20 | uVar13);
  }
  pVar18 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar2,(unsigned_long_long *)local_260);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
LAB_001077d0:
    if (local_130 != &local_120) {
      operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
    }
    if (local_110 != (long *)&local_100) {
      operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
    }
    if (local_f0 != (long *)&local_e0) {
      operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
    }
    return;
  }
  iVar16 = (*(pTVar6->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[1])
                     ();
  local_230 = (char *)CONCAT44(extraout_var,iVar16);
  *(undefined8 *)(local_230 + 0xa7a0) = extraout_RDX;
  local_230[0xa799] = '\0';
  strcpy(local_230,local_190);
  __nptr = local_f0;
  piVar10 = __errno_location();
  iVar16 = *piVar10;
  *piVar10 = 0;
  lVar11 = strtol((char *)__nptr,(char **)local_260,10);
  plVar9 = local_110;
  pcVar4 = local_230;
  if (local_260[0] == __nptr) goto LAB_00107990;
  if (((int)lVar11 != lVar11) || (*piVar10 == 0x22)) goto LAB_0010799c;
  if (*piVar10 == 0) {
    *piVar10 = iVar16;
  }
  *(int *)(local_230 + 0x18) = (int)lVar11;
  iVar16 = *piVar10;
  *piVar10 = 0;
  lVar11 = strtol((char *)local_110,(char **)local_260,10);
  pcVar5 = local_230;
  if (local_260[0] != plVar9) {
    if ((0xfffffffeffffffff < lVar11 - 0x80000000U) && (*piVar10 != 0x22)) {
      if (*piVar10 == 0) {
        *piVar10 = iVar16;
      }
      uVar8 = (undefined4)lVar11;
      *(undefined4 *)(pcVar4 + 0x1c) = uVar8;
      if (0 < *(int *)(pcVar4 + 0x18)) {
        lVar11 = 0;
        pcVar12 = pcVar4;
        do {
          lVar15 = 0x13;
          do {
            pcVar1 = pcVar12 + lVar15 * 4;
            *(undefined4 *)pcVar1 = uVar8;
            *(undefined4 *)(pcVar1 + 4) = uVar8;
            *(undefined4 *)(pcVar1 + 8) = uVar8;
            *(undefined4 *)(pcVar1 + 0xc) = uVar8;
            lVar15 = lVar15 + 4;
          } while (lVar15 != 0x6f);
          lVar11 = lVar11 + 1;
          pcVar12 = pcVar12 + 0x1a8;
        } while (lVar11 < *(int *)(pcVar4 + 0x18));
        if (0 < *(int *)(pcVar4 + 0x18)) {
          iVar7 = (int)local_1a8;
          local_240 = (char *)(long)iVar7;
          lVar11 = 0;
          iVar16 = 0;
          do {
            iVar17 = iVar16;
            if (iVar16 < iVar7) {
              lVar15 = 0;
              do {
                if (local_1b0[lVar15 + iVar16] == '|') {
                  iVar17 = (int)lVar15 + iVar16;
                  break;
                }
                lVar15 = lVar15 + 1;
                iVar17 = iVar7;
              } while ((long)local_240 - (long)iVar16 != lVar15);
            }
            std::__cxx11::string::substr((ulong)local_260,(ulong)&local_1b0);
            strcpy(pcVar5 + lVar11 * 0x1a8 + 0x20,(char *)local_260[0]);
            if (local_260[0] != local_250) {
              operator_delete(local_260[0],local_250[0] + 1);
            }
            lVar11 = lVar11 + 1;
            iVar16 = iVar17 + 1;
          } while (lVar11 < *(int *)(pcVar4 + 0x18));
          if (1 < *(int *)(pcVar4 + 0x18)) {
            local_240 = local_1c8;
            local_238 = (long)(int)local_1c8;
            iVar16 = 0;
            lVar11 = 1;
            do {
              iVar7 = iVar16;
              if (iVar16 < (int)local_240) {
                lVar15 = 0;
                do {
                  if (local_1d0[lVar15 + iVar16] == '|') {
                    iVar7 = (int)lVar15 + iVar16;
                    break;
                  }
                  lVar15 = lVar15 + 1;
                  iVar7 = (int)local_240;
                } while (local_238 - iVar16 != lVar15);
              }
              std::__cxx11::string::substr((ulong)local_260,(ulong)&local_1d0);
              plVar9 = local_260[0];
              iVar16 = *piVar10;
              *piVar10 = 0;
              lVar15 = strtol((char *)local_260[0],(char **)local_228,10);
              if (local_228[0] == plVar9) goto LAB_00107978;
              if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22))
              goto LAB_00107984;
              if (*piVar10 == 0) {
                *piVar10 = iVar16;
              }
              *(int *)(pcVar5 + lVar11 * 0x1a8 + 0x1bc) = (int)lVar15;
              if (local_260[0] != local_250) {
                operator_delete(local_260[0],local_250[0] + 1);
              }
              lVar11 = lVar11 + 1;
              iVar16 = iVar7 + 1;
            } while (lVar11 < *(int *)(pcVar4 + 0x18));
          }
        }
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_150,local_150 + local_148)
      ;
      timeType::timeType((timeType *)local_260,&local_90);
      *(long **)(pcVar4 + 0xa788) = local_260[0];
      *(long **)(pcVar4 + 0xa790) = local_260[1];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (1 < *(int *)(pcVar4 + 0x18)) {
        local_240 = local_230 + 0x20;
        iVar7 = (int)local_1e8;
        local_238 = (long)iVar7;
        iVar16 = 0;
        lVar11 = 1;
        do {
          iVar17 = iVar16;
          if (iVar16 < iVar7) {
            lVar15 = 0;
            do {
              if (local_1f0[lVar15 + iVar16] == '|') {
                iVar17 = (int)lVar15 + iVar16;
                break;
              }
              lVar15 = lVar15 + 1;
              iVar17 = iVar7;
            } while (local_238 - iVar16 != lVar15);
          }
          std::__cxx11::string::substr((ulong)local_260,(ulong)&local_1f0);
          plVar9 = local_260[0];
          iVar16 = *piVar10;
          *piVar10 = 0;
          lVar15 = strtol((char *)local_260[0],(char **)local_228,10);
          if (local_228[0] == plVar9) {
            std::__throw_invalid_argument("stoi");
LAB_00107954:
            std::__throw_out_of_range("stoi");
            goto LAB_00107960;
          }
          if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_00107954;
          if (*piVar10 == 0) {
            *piVar10 = iVar16;
          }
          *(int *)(local_240 + lVar11 * 0x1a8 + 0x1a4) = (int)lVar15;
          if (local_260[0] != local_250) {
            operator_delete(local_260[0],local_250[0] + 1);
          }
          lVar11 = lVar11 + 1;
          iVar16 = iVar17 + 1;
        } while (lVar11 < *(int *)(pcVar4 + 0x18));
        if (2 < *(int *)(pcVar4 + 0x18)) {
          iVar16 = (int)local_208;
          local_238 = (long)iVar16;
          iVar7 = 0;
          lVar11 = 1;
          do {
            iVar17 = iVar7;
            if (iVar7 < iVar16) {
              lVar15 = 0;
              do {
                if (local_210[lVar15 + iVar7] == '|') {
                  iVar17 = (int)lVar15 + iVar7;
                  break;
                }
                lVar15 = lVar15 + 1;
                iVar17 = iVar16;
              } while (local_238 - iVar7 != lVar15);
            }
            std::__cxx11::string::substr((ulong)local_260,(ulong)&local_210);
            plVar9 = local_260[0];
            iVar7 = *piVar10;
            *piVar10 = 0;
            lVar15 = strtol((char *)local_260[0],(char **)local_228,10);
            if (local_228[0] == plVar9) goto LAB_00107960;
            if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22))
            goto LAB_0010796c;
            if (*piVar10 == 0) {
              *piVar10 = iVar7;
            }
            *(int *)(local_240 + lVar11 * 0x1a8 + 0x1a0) = (int)lVar15;
            if (local_260[0] != local_250) {
              operator_delete(local_260[0],local_250[0] + 1);
            }
            lVar11 = lVar11 + 1;
            iVar7 = iVar17 + 1;
          } while (lVar11 < (long)*(int *)(pcVar4 + 0x18) + -1);
        }
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_170);
      timeType::timeType((timeType *)local_260,&local_50);
      pTVar6 = local_218;
      pcVar5 = local_230;
      *(long **)(pcVar4 + 0xa768) = local_260[0];
      *(long **)(pcVar4 + 0xa770) = local_260[1];
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_170);
      timeType::timeType((timeType *)local_228,&local_70);
      *(long **)(pcVar4 + 0xa778) = local_228[0];
      *(long **)(pcVar4 + 0xa780) = local_228[1];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pcVar4[0xa798] = *local_130;
      pDVar3 = pTVar6->TrainFile;
      (*(pDVar3->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])
                (pDVar3,pcVar5 + 0xa7a0);
      pBVar2 = pTVar6->TrainBpTree;
      std::__cxx11::string::string((string *)&local_b0,pcVar4,(allocator *)local_228);
      if (local_a8 == 0) {
        local_260[0] = (long *)0x0;
      }
      else {
        lVar15 = 0;
        lVar11 = 0;
        uVar13 = 0;
        do {
          lVar11 = ((long)*(char *)((long)local_b0 + lVar15) + lVar11 * 0x239 + 0x100) % 0x3b800001;
          uVar13 = (long)((long)*(char *)((long)local_b0 + lVar15) + uVar13 * 0x301 + 0x100) %
                   0x3b9aca07;
          lVar15 = lVar15 + 1;
        } while (local_a8 != lVar15);
        local_260[0] = (long *)(lVar11 << 0x20 | uVar13);
      }
      local_260[1] = *(long **)(pcVar5 + 0xa7a0);
      BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
                (pBVar2,(value_type *)local_260);
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      goto LAB_001077d0;
    }
    goto LAB_001079b4;
  }
  goto LAB_001079a8;
LAB_00107960:
  std::__throw_invalid_argument("stoi");
LAB_0010796c:
  std::__throw_out_of_range("stoi");
LAB_00107978:
  std::__throw_invalid_argument("stoi");
LAB_00107984:
  std::__throw_out_of_range("stoi");
LAB_00107990:
  std::__throw_invalid_argument("stoi");
LAB_0010799c:
  std::__throw_out_of_range("stoi");
LAB_001079a8:
  std::__throw_invalid_argument("stoi");
LAB_001079b4:
  std::__throw_out_of_range("stoi");
LAB_001079c0:
  this_00 = (invalid_command *)__cxa_allocate_exception(0x68);
  invalid_command::invalid_command(this_00);
  __cxa_throw(this_00,&invalid_command::typeinfo,invalid_command::~invalid_command);
}

Assistant:

void add_train(int argc , std::string *argv)
		{
			std::string trainID , stationNum , seatNum , stations , prices , startTime , travelTimes , stopoverTimes , saleDate , type;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else if (argv[i] == "-n") stationNum = argv[i + 1];
				else if (argv[i] == "-m") seatNum = argv[i + 1];
				else if (argv[i] == "-s") stations = argv[i + 1];
				else if (argv[i] == "-p") prices = argv[i + 1];
				else if (argv[i] == "-x") startTime = argv[i + 1];
				else if (argv[i] == "-t") travelTimes = argv[i + 1];
				else if (argv[i] == "-o") stopoverTimes = argv[i + 1];
				else if (argv[i] == "-d") saleDate = argv[i + 1];
				else if (argv[i] == "-y") type = argv[i + 1];
				else throw invalid_command();
			if (TrainBpTree -> find(hasher(trainID)).second) std::cout << -1 << std::endl;
			else
			{
				auto ret = TrainFile -> newspace();
				trainType *train = ret.first;
				train -> offset = ret.second , train -> is_released = false;
				strcpy(train -> trainID , trainID.c_str());
				train -> stationNum = stoi(stationNum) , train -> seatNum = stoi(seatNum);
				for (int i = 0;i < train -> stationNum;++ i)
					for (int j = 0;j < 92;++ j)
						train -> stations[i].seatNum[j] = train -> seatNum;
				for (int i = 0 , l = 0 , r , len = stations.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && stations[r] != '|';++ r);
					strcpy(train -> stations[i].stationName , stations.substr(l , r - l).c_str());
				}
				for (int i = 1 , l = 0 , r , len = prices.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && prices[r] != '|';++ r);
					train -> stations[i].price = stoi(prices.substr(l , r - l));
				}
				train -> startTime = timeType(startTime);
				for (int i = 1 , l = 0 , r , len = travelTimes.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && travelTimes[r] != '|';++ r);
					train -> stations[i].travelTime = stoi(travelTimes.substr(l , r - l));
				}
				for (int i = 1 , l = 0 , r , len = stopoverTimes.size();i < train -> stationNum - 1;++ i , l = r + 1)
				{
					for (r = l;r < len && stopoverTimes[r] != '|';++ r);
					train -> stations[i].stopoverTime = stoi(stopoverTimes.substr(l , r - l));
				}
				train -> saleDate[0] = timeType(saleDate.substr(0 , 5)) , train -> saleDate[1] = timeType(saleDate.substr(6 , 5));
				train -> type = type[0];
				TrainFile -> save(train -> offset) , TrainBpTree -> insert(std::make_pair(hasher(train -> trainID) , train -> offset));
				std::cout << 0 << std::endl;
			}
		}